

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dots.c
# Opt level: O0

int makeDots(float radius,point3d *points,int maxpnts)

{
  bool bVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int local_84;
  int nhoriz;
  int nvert;
  int nequator;
  int odd;
  int k;
  int j;
  int i;
  double z0;
  double y0;
  double x0;
  double xy0;
  double theta;
  double phi;
  double sinang;
  double cosang;
  double ang;
  float offset;
  int maxpnts_local;
  point3d *points_local;
  float radius_local;
  
  dVar3 = sqrt((double)maxpnts * 3.14159265359);
  dVar3 = floor(dVar3);
  bVar1 = true;
  dVar4 = cos(0.04363323129986111);
  dVar5 = sin(0.04363323129986111);
  k = 0;
  iVar2 = (int)dVar3 / 2;
  odd = 0;
  do {
    if (iVar2 < odd) {
      return k;
    }
    dVar6 = ((double)odd * 3.14159265359) / (double)iVar2;
    dVar7 = cos(dVar6);
    dVar8 = sin(dVar6);
    dVar6 = sin(dVar6);
    dVar6 = floor((double)(int)dVar3 * dVar6);
    local_84 = (int)dVar6;
    if (local_84 < 1) {
      local_84 = 1;
    }
    for (nequator = 0; nequator < local_84; nequator = nequator + 1) {
      if (bVar1) {
        xy0 = ((double)nequator * 6.28318530718 + 0.20000000298023224) / (double)local_84;
      }
      else {
        xy0 = ((double)nequator * 6.28318530718) / (double)local_84;
      }
      dVar6 = cos(xy0);
      dVar9 = sin(xy0);
      dVar9 = dVar9 * dVar8 * (double)radius;
      if (maxpnts <= k) {
        return k;
      }
      points[k].x = dVar6 * dVar8 * (double)radius;
      points[k].y = dVar9 * dVar4 + -(dVar7 * (double)radius * dVar5);
      points[k].z = dVar9 * dVar5 + dVar7 * (double)radius * dVar4;
      k = k + 1;
    }
    bVar1 = (bool)(bVar1 ^ 1);
    odd = odd + 1;
  } while( true );
}

Assistant:

int makeDots(float radius, point3d points[], int maxpnts) {
   float offset = 0.2;
   double ang, cosang, sinang, phi, theta, xy0, x0, y0, z0;
   int i, j, k, odd, nequator, nvert, nhoriz;

   nequator = (int)floor(sqrt(maxpnts * PI));

   odd = 1;
   ang = 5.0 * PI / 360.0;
   cosang = cos(ang);
   sinang = sin(ang);

   i = 0;
   nvert = nequator / 2;
   for (j = 0; j <= nvert; j++) {
      phi = (PI * j) / nvert;
      z0 = cos(phi) * radius;
      xy0= sin(phi) * radius;

      nhoriz = (int)floor(nequator * sin(phi));
      if (nhoriz < 1) nhoriz = 1;
      for (k = 0; k < nhoriz; k++) {
	 if(odd) {theta = (2.0 * PI * k + offset)/nhoriz; }
	 else    {theta = (2.0 * PI * k         )/nhoriz; }
	 x0 = cos(theta) * xy0;
	 y0 = sin(theta) * xy0;

	 if (i >= maxpnts) return i;
	 points[i].x = x0;
	 points[i].y = y0*cosang - z0*sinang;
	 points[i].z = y0*sinang + z0*cosang;
	 i++;
      }
      odd = !odd;
   }
   return i;
}